

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_SimdInt32x4FromFloat32x4<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  Type *pTVar1;
  long lVar2;
  long lVar3;
  SIMDValue SVar4;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 local_38;
  bool local_21;
  
  pTVar1 = (Type *)(*(long *)(this + 0x148) + (ulong)playout->F4_1 * 0x10);
  local_38.f64[0] = *pTVar1;
  local_38.f64[1] = pTVar1[1];
  local_21 = SIMDAnyNaN(this,(AsmJsSIMDValue *)&local_38);
  if (!local_21) {
    SVar4 = SIMDInt32x4Operation::OpFromFloat32x4((SIMDValue *)&local_38,&local_21);
    if ((local_21 & 1U) == 0) {
      lVar2 = *(long *)(this + 0x148);
      lVar3 = (ulong)playout->I4_0 * 0x10;
      *(long *)(lVar2 + lVar3) = SVar4.field_0._0_8_;
      *(long *)(lVar2 + 8 + lVar3) = SVar4.field_0._8_8_;
      return;
    }
  }
  JavascriptError::ThrowRangeError
            (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"SIMD.Int32x4.FromFloat32x4");
}

Assistant:

void InterpreterStackFrame::OP_SimdInt32x4FromFloat32x4(const unaligned T* playout)
    {
        bool throws = false;
        AsmJsSIMDValue input = GetRegRawSimd(playout->F4_1);
        AsmJsSIMDValue result{ 0 };

#ifdef ENABLE_WASM_SIMD
        throws = SIMDAnyNaN(input);
        if (!throws)
#endif
        {
            result = SIMDInt32x4Operation::OpFromFloat32x4(input, throws);
        }

        // value is out of bound
        if (throws)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("SIMD.Int32x4.FromFloat32x4"));
        }
        SetRegRawSimd(playout->I4_0, result);
    }